

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Float32_To_UInt8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  int in_ECX;
  float *in_RDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  PaUtilTriangularDitherGenerator *in_R9;
  float fVar1;
  PaInt32 samp;
  float dithered;
  float dither;
  uchar *dest;
  float *src;
  char *local_38;
  float *local_30;
  int local_20;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  local_20 = in_R8D;
  while (local_20 != 0) {
    fVar1 = PaUtil_GenerateFloatTriangularDither(in_R9);
    *local_38 = (char)(int)(*local_30 * 126.0 + fVar1) + -0x80;
    local_30 = local_30 + in_ECX;
    local_38 = local_38 + in_ESI;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void Float32_To_UInt8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;
    
    while( count-- )
    {
        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (126.0f)) + dither;
        PaInt32 samp = (PaInt32) dithered;
        *dest = (unsigned char) (128 + samp);
        
        src += sourceStride;
        dest += destinationStride;
    }
}